

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noHash.c
# Opt level: O3

uint64_t * noHashBlockFromFile(uint8_t *fname,SkeinSize_t state_size)

{
  _Bool _Var1;
  uint64_t uVar2;
  int_fast32_t iVar3;
  uint64_t *puVar4;
  uint __fd;
  
  _Var1 = exists(fname);
  if (_Var1) {
    uVar2 = getFileSize(fname);
    if (state_size >> 3 <= uVar2) {
      puts(
          "***Warning*** You have turned off password hashing and specified a password file. If the file you have specified is shorter then the key size it will be rejected. If it is greater then the keysize then all bits greater then the key size will be truncated. This poses a security risk (do not do this unless you know exactly what you are doing)"
          );
      iVar3 = openForRead(fname);
      __fd = (uint)iVar3;
      if (0 < (int)__fd) {
        puVar4 = (uint64_t *)readBytes((ulong)(state_size >> 3),(ulong)(__fd & 0x7fffffff));
        close(__fd);
        return puVar4;
      }
    }
  }
  return (uint64_t *)0x0;
}

Assistant:

uint64_t* noHashBlockFromFile(const uint8_t* fname, const SkeinSize_t state_size)
{
    uint64_t* block = NULL;
    const uint64_t block_byte_size = state_size/8;

    if(exists(fname) && getFileSize(fname) >= block_byte_size)
    {
        printf("***Warning*** You have turned off password hashing and specified a password file. If the file you have specified is shorter then the key size it will be rejected. If it is greater then the keysize then all bits greater then the key size will be truncated. This poses a security risk (do not do this unless you know exactly what you are doing)\n");

	    int fd = openForRead(fname);
	    if(fd > 0)
	    {
	        block = (uint64_t*)readBytes(block_byte_size, fd);
	        close(fd); 
	    }
    }

    return block;
}